

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_protocol.h
# Opt level: O1

string * __thiscall
cppcms::http::protocol::unquote<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
          (string *__return_storage_ptr__,protocol *this,
          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *begin,__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 end)

{
  char cVar1;
  pointer pcVar2;
  bool bVar3;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *p_Var4;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *p_Var5;
  
  p_Var5 = *(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             **)this;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if ((p_Var5 < begin) && (*(char *)&p_Var5->_M_current == '\"')) {
    std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
    bVar3 = false;
    p_Var5 = (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)((long)&p_Var5->_M_current + 1);
    do {
      if (begin <= p_Var5) {
        __return_storage_ptr__->_M_string_length = 0;
        *(__return_storage_ptr__->_M_dataplus)._M_p = '\0';
        return __return_storage_ptr__;
      }
      p_Var4 = (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)((long)&p_Var5->_M_current + 1);
      cVar1 = *(char *)&p_Var5->_M_current;
      if (cVar1 == '\"') {
        *(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          **)this = p_Var4;
        bVar3 = true;
      }
      else if (p_Var4 < begin && cVar1 == '\\') {
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
        p_Var4 = (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)((long)&p_Var5->_M_current + 2);
      }
      else {
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
      }
      p_Var5 = p_Var4;
    } while (cVar1 != '\"');
    if ((!bVar3) &&
       (pcVar2 = (__return_storage_ptr__->_M_dataplus)._M_p,
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)pcVar2 != &__return_storage_ptr__->field_2)) {
      operator_delete(pcVar2);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string unquote(It &begin,It end)
	{
		It p=begin;
		std::string result;
		if(p>=end || *p!='\"')
			return result;
		result.reserve(end-p);
		p++;
		while(p < end) {
			char c=*p++;
			if(c=='\"') {
				begin=p;
				return result;
			}
			else if(c=='\\' && p<end)
				result+= *p++;
			else
				result+=c;
		}
		result.clear();
		return result;
	}